

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayInsert(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  InternalException *this_00;
  DataTable *this_01;
  optional_ptr<duckdb::TableCatalogEntry,_true> *poVar1;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  DataChunk chunk;
  string local_88;
  DataChunk local_60;
  
  DataChunk::DataChunk(&local_60);
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"chunk");
  (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
  DataChunk::Deserialize(&local_60,&deserializer->super_Deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    if ((this->state->current_table).ptr == (TableCatalogEntry *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Corrupt WAL: insert without table","");
      InternalException::InternalException(this_00,&local_88);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    poVar1 = &this->state->current_table;
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(poVar1);
    (*(poVar1->ptr->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
      [0x10])();
    poVar1 = &this->state->current_table;
    this_01 = (DataTable *)poVar1;
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(poVar1);
    DataTable::LocalWALAppend
              (this_01,poVar1->ptr,this->context,&local_60,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)&local_88);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&local_88);
  }
  DataChunk::~DataChunk(&local_60);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayInsert() {
	DataChunk chunk;
	deserializer.ReadObject(101, "chunk", [&](Deserializer &object) { chunk.Deserialize(object); });
	if (DeserializeOnly()) {
		return;
	}
	if (!state.current_table) {
		throw InternalException("Corrupt WAL: insert without table");
	}

	// Append to the current table without constraint verification.
	vector<unique_ptr<BoundConstraint>> bound_constraints;
	auto &storage = state.current_table->GetStorage();
	storage.LocalWALAppend(*state.current_table, context, chunk, bound_constraints);
}